

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

exr_result_t generic_unpack(exr_decode_pipeline_t *decode)

{
  char cVar1;
  int iVar2;
  int iVar3;
  exr_coding_channel_info_t *peVar4;
  uint8_t *puVar5;
  uint16_t uVar6;
  float fVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  void *pvVar15;
  long lVar16;
  int iVar17;
  float *pfVar18;
  
  pvVar15 = decode->unpacked_buffer;
  lVar12 = (long)decode->user_line_begin_skip;
  uVar10 = (decode->chunk).height - decode->user_line_end_ignore;
  uVar11 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar11 = 0;
  }
  uVar13 = 0;
  do {
    if (uVar13 == uVar11) {
      return 0;
    }
    iVar2 = (decode->chunk).start_y;
    uVar8 = uVar13 - lVar12;
    for (lVar14 = 0; lVar14 < decode->channel_count; lVar14 = lVar14 + 1) {
      peVar4 = decode->channels;
      puVar5 = peVar4[lVar14].field_12.decode_to_ptr;
      iVar3 = peVar4[lVar14].width;
      iVar17 = peVar4[lVar14].y_samples;
      cVar1 = peVar4[lVar14].bytes_per_element;
      lVar16 = (long)peVar4[lVar14].user_pixel_stride;
      if (iVar17 < 2) {
        if ((lVar12 <= (long)uVar13) && (puVar5 != (uint8_t *)0x0)) {
          lVar9 = (long)peVar4[lVar14].user_line_stride * uVar8;
          goto LAB_00129d91;
        }
LAB_00129e02:
        pvVar15 = (void *)((long)pvVar15 + (long)(iVar3 * cVar1));
      }
      else if ((iVar2 + (int)uVar13) % iVar17 == 0) {
        if (((long)uVar13 < lVar12) || (puVar5 == (uint8_t *)0x0)) goto LAB_00129e02;
        lVar9 = (long)peVar4[lVar14].user_line_stride *
                (long)(int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) /
                           (long)iVar17);
LAB_00129d91:
        pfVar18 = (float *)(puVar5 + lVar9);
        uVar6 = peVar4[lVar14].data_type;
        if (uVar6 == 0) {
          uVar6 = peVar4[lVar14].user_data_type;
          if (uVar6 == 2) {
            iVar17 = 0;
            if (0 < iVar3) {
              iVar17 = iVar3;
            }
            for (lVar9 = 0; iVar17 != (int)lVar9; lVar9 = lVar9 + 1) {
              *pfVar18 = (float)*(uint *)((long)pvVar15 + lVar9 * 4);
              pfVar18 = (float *)((long)pfVar18 + lVar16);
            }
          }
          else if (uVar6 == 1) {
            iVar17 = 0;
            if (0 < iVar3) {
              iVar17 = iVar3;
            }
            for (lVar9 = 0; iVar17 != (int)lVar9; lVar9 = lVar9 + 1) {
              uVar6 = uint_to_half(*(uint32_t *)((long)pvVar15 + lVar9 * 4));
              *(uint16_t *)pfVar18 = uVar6;
              pfVar18 = (float *)((long)pfVar18 + lVar16);
            }
          }
          else {
            if (uVar6 != 0) {
              return 3;
            }
            iVar17 = 0;
            if (0 < iVar3) {
              iVar17 = iVar3;
            }
            for (lVar9 = 0; iVar17 != (int)lVar9; lVar9 = lVar9 + 1) {
              *pfVar18 = *(float *)((long)pvVar15 + lVar9 * 4);
              pfVar18 = (float *)((long)pfVar18 + lVar16);
            }
          }
        }
        else if (uVar6 == 2) {
          uVar6 = peVar4[lVar14].user_data_type;
          if (uVar6 == 2) {
            iVar17 = 0;
            if (0 < iVar3) {
              iVar17 = iVar3;
            }
            for (lVar9 = 0; iVar17 != (int)lVar9; lVar9 = lVar9 + 1) {
              *pfVar18 = *(float *)((long)pvVar15 + lVar9 * 4);
              pfVar18 = (float *)((long)pfVar18 + lVar16);
            }
          }
          else if (uVar6 == 1) {
            iVar17 = 0;
            if (0 < iVar3) {
              iVar17 = iVar3;
            }
            for (lVar9 = 0; iVar17 != (int)lVar9; lVar9 = lVar9 + 1) {
              uVar6 = float_to_half(*(float *)((long)pvVar15 + lVar9 * 4));
              *(uint16_t *)pfVar18 = uVar6;
              pfVar18 = (float *)((long)pfVar18 + lVar16);
            }
          }
          else {
            if (uVar6 != 0) {
              return 3;
            }
            iVar17 = 0;
            if (0 < iVar3) {
              iVar17 = iVar3;
            }
            for (lVar9 = 0; iVar17 != (int)lVar9; lVar9 = lVar9 + 1) {
              fVar7 = (float)float_to_uint_int(*(uint32_t *)((long)pvVar15 + lVar9 * 4));
              *pfVar18 = fVar7;
              pfVar18 = (float *)((long)pfVar18 + lVar16);
            }
          }
        }
        else {
          if (uVar6 != 1) {
            return 3;
          }
          uVar6 = peVar4[lVar14].user_data_type;
          if (uVar6 == 2) {
            iVar17 = 0;
            if (0 < iVar3) {
              iVar17 = iVar3;
            }
            for (lVar9 = 0; iVar17 != (int)lVar9; lVar9 = lVar9 + 1) {
              fVar7 = half_to_float(*(uint16_t *)((long)pvVar15 + lVar9 * 2));
              *pfVar18 = fVar7;
              pfVar18 = (float *)((long)pfVar18 + lVar16);
            }
          }
          else if (uVar6 == 1) {
            iVar17 = 0;
            if (0 < iVar3) {
              iVar17 = iVar3;
            }
            for (lVar9 = 0; iVar17 != (int)lVar9; lVar9 = lVar9 + 1) {
              *(uint16_t *)pfVar18 = *(uint16_t *)((long)pvVar15 + lVar9 * 2);
              pfVar18 = (float *)((long)pfVar18 + lVar16);
            }
          }
          else {
            if (uVar6 != 0) {
              return 3;
            }
            iVar17 = 0;
            if (0 < iVar3) {
              iVar17 = iVar3;
            }
            for (lVar9 = 0; iVar17 != (int)lVar9; lVar9 = lVar9 + 1) {
              fVar7 = (float)half_to_uint(*(uint16_t *)((long)pvVar15 + lVar9 * 2));
              *pfVar18 = fVar7;
              pfVar18 = (float *)((long)pfVar18 + lVar16);
            }
          }
        }
        pvVar15 = (void *)((long)pvVar15 + (long)(iVar3 * cVar1));
      }
    }
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

static exr_result_t
generic_unpack (exr_decode_pipeline_t* decode)
{
    const uint8_t* srcbuffer = decode->unpacked_buffer;
    uint8_t*       cdata;
    int            w, h, bpc, ubpc, uls;

    uls = decode->user_line_begin_skip;
    h = decode->chunk.height - decode->user_line_end_ignore;
    /*
     * user data starts at user line begin skip but because of
     * y_samples > 1 case, need to embed the run the loop and skip,
     * incrementing srcbuffer only when there'd be a line...
     */
    for (int y = 0; y < h; ++y)
    {
        int cury = (int)( (int64_t) y +
                          (int64_t) decode->chunk.start_y );

        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc = (decode->channels + c);

            cdata = decc->decode_to_ptr;
            w     = decc->width;
            bpc   = decc->bytes_per_element;
            ubpc  = decc->user_pixel_stride;

            /* avoid a mod operation if we can */
            if (decc->y_samples > 1)
            {
                if ((cury % decc->y_samples) != 0) continue;
                if (y < uls || !cdata)
                {
                    srcbuffer += w * bpc;
                    continue;
                }

                cdata +=
                    ((uint64_t) ((y - uls) / decc->y_samples) *
                     (uint64_t) decc->user_line_stride);
            }
            else
            {
                if (y < uls || !cdata)
                {
                    srcbuffer += w * bpc;
                    continue;
                }

                cdata += ((uint64_t) (y - uls)) * ((uint64_t) decc->user_line_stride);
            }

            UNPACK_SAMPLES (w)
            srcbuffer += w * bpc;
        }
    }
    return EXR_ERR_SUCCESS;
}